

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_logging.cc
# Opt level: O0

bool google::VADoRawLog(char **buf,size_t *size,char *format,__va_list_tag *ap)

{
  int iVar1;
  int n;
  __va_list_tag *ap_local;
  char *format_local;
  size_t *size_local;
  char **buf_local;
  
  iVar1 = vsnprintf(*buf,*size,format,ap);
  if ((iVar1 < 0) || (*size < (ulong)(long)iVar1)) {
    buf_local._7_1_ = false;
  }
  else {
    *size = *size - (long)iVar1;
    *buf = *buf + iVar1;
    buf_local._7_1_ = true;
  }
  return buf_local._7_1_;
}

Assistant:

inline static bool VADoRawLog(char** buf, size_t* size, const char* format,
                              va_list ap) {
#if defined(__GNUC__)
#  pragma GCC diagnostic push
#  pragma GCC diagnostic ignored "-Wformat-nonliteral"
#endif
  int n = std::vsnprintf(*buf, *size, format, ap);
#if defined(__GNUC__)
#  pragma GCC diagnostic pop
#endif
  if (n < 0 || static_cast<size_t>(n) > *size) return false;
  *size -= static_cast<size_t>(n);
  *buf += n;
  return true;
}